

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O3

Value __thiscall xmrig::OclConfig::toJSON(OclConfig *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *in_RDX;
  undefined8 extraout_RDX;
  Value VVar1;
  Data local_58;
  Data local_48;
  Document *local_38;
  
  allocator = in_RDX->allocator_;
  this->m_cache = false;
  this->m_enabled = false;
  this->m_shouldSave = false;
  *(undefined5 *)&this->field_0x3 = 0;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)
   ((long)&(this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 6) = 3;
  local_58.s.str = (Ch *)0x405000000188227;
  local_58.n = (Number)0x7;
  local_48.n = (Number)0x0;
  local_48.s.str =
       (Ch *)((ulong)(ushort)((byte)(doc->
                                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ).data_.ss.str[1] + 9) << 0x30);
  local_38 = in_RDX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_58.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,allocator);
  local_58.s.str = (Ch *)0x405000000188325;
  local_58.n = (Number)0x5;
  local_48.n = (Number)0x0;
  local_48.s.str =
       (Ch *)((ulong)(ushort)((byte)(doc->
                                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ).data_.ss.str[0] + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_58.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,allocator);
  String::toJSON((String *)&local_58.s);
  local_48.s.str = (Ch *)0x405000000188335;
  local_48.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,allocator);
  if ((doc->stack_).stackTop_ == (char *)0x0) {
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_58._0_4_ = *(uint *)&doc[1].allocator_;
    local_58.s.str =
         (Ch *)((ulong)(-1 < (int)*(uint *)&doc[1].allocator_) << 0x35 | 0x1d6000000000000);
  }
  else {
    String::toJSON((String *)&local_58.s);
  }
  local_48.s.str = (Ch *)0x405000000188304;
  local_48.n = (Number)0x8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,allocator);
  Threads<xmrig::OclThreads>::toJSON
            ((Threads<xmrig::OclThreads> *)&(doc->stack_).stackEnd_,(Value *)this,local_38);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::OclConfig::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kEnabled),  m_enabled, allocator);
    obj.AddMember(StringRef(kCache),    m_cache, allocator);
    obj.AddMember(StringRef(kLoader),   m_loader.toJSON(), allocator);
    obj.AddMember(StringRef(kPlatform), m_platformVendor.isEmpty() ? Value(m_platformIndex) : m_platformVendor.toJSON(), allocator);

    m_threads.toJSON(obj, doc);

    return obj;
}